

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7ComposeLut4(int t,word (*f) [2],word *r)

{
  ulong local_48;
  ulong local_40;
  ulong local_38;
  word c [2];
  int v;
  int m;
  word *r_local;
  word (*f_local) [2];
  int t_local;
  
  r[1] = 0;
  *r = 0;
  for (c[1]._4_4_ = 0; c[1]._4_4_ < 0x10; c[1]._4_4_ = c[1]._4_4_ + 1) {
    if ((t >> ((byte)c[1]._4_4_ & 0x1f) & 1U) != 0) {
      c[0] = 0xffffffffffffffff;
      local_38 = 0xffffffffffffffff;
      for (c[1]._0_4_ = 0; (int)c[1] < 4; c[1]._0_4_ = (int)c[1] + 1) {
        if ((c[1]._4_4_ >> ((byte)(int)c[1] & 0x1f) & 1U) == 0) {
          local_40 = f[(int)c[1]][0] ^ 0xffffffffffffffff;
        }
        else {
          local_40 = f[(int)c[1]][0];
        }
        local_38 = local_40 & local_38;
        if ((c[1]._4_4_ >> ((byte)(int)c[1] & 0x1f) & 1U) == 0) {
          local_48 = f[(int)c[1]][1] ^ 0xffffffffffffffff;
        }
        else {
          local_48 = f[(int)c[1]][1];
        }
        c[0] = local_48 & c[0];
      }
      *r = local_38 | *r;
      r[1] = c[0] | r[1];
    }
  }
  return;
}

Assistant:

static void If_Dec7ComposeLut4( int t, word f[4][2], word r[2] )
{
    int m, v;
    word c[2];
    r[0] = r[1] = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c[0] = c[1] = ~(word)0;
        for ( v = 0; v < 4; v++ )
        {
            c[0] &= ((m >> v) & 1) ? f[v][0] : ~f[v][0];
            c[1] &= ((m >> v) & 1) ? f[v][1] : ~f[v][1];
        }
        r[0] |= c[0];
        r[1] |= c[1];
    }
}